

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  size_t extraout_RDX;
  long extraout_RDX_00;
  long in_FS_OFFSET;
  Slice key;
  Slice k;
  Slice local_70;
  Slice local_60;
  Status local_50;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*this->iter_->_vptr_Iterator[8])();
  local_48.data_ = (char *)CONCAT44(extraout_var,iVar3);
  (*this->iter_->_vptr_Iterator[9])();
  while (this->bytes_until_read_sampling_ < extraout_RDX_00 + extraout_RDX) {
    sVar4 = RandomCompactionPeriod(this);
    this->bytes_until_read_sampling_ = this->bytes_until_read_sampling_ + sVar4;
    key.size_ = extraout_RDX;
    key.data_ = (char *)CONCAT44(extraout_var,iVar3);
    DBImpl::RecordReadSample(this->db_,key);
  }
  this->bytes_until_read_sampling_ =
       this->bytes_until_read_sampling_ - (extraout_RDX_00 + extraout_RDX);
  bVar2 = ParseInternalKey(&local_48,ikey);
  if (!bVar2) {
    local_60.data_ = "corrupted internal key in DBIter";
    local_60.size_ = 0x20;
    local_70.data_ = "";
    local_70.size_ = 0;
    Status::Corruption(&local_50,&local_60,&local_70);
    pcVar1 = (this->status_).state_;
    (this->status_).state_ = local_50.state_;
    local_50.state_ = pcVar1;
    Status::~Status(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}